

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableTest_ModifyViaIterator_Test::TestBody(HashtableTest_ModifyViaIterator_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  data_type *pdVar7;
  pointer ppVar8;
  AssertionResult *assertion_result;
  pointer this_00;
  pointer lhs_expression;
  pointer lhs;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar__2;
  iterator it_1;
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ht_1;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  iterator it;
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ht;
  iterator *in_stack_fffffffffffffa88;
  undefined7 in_stack_fffffffffffffa90;
  undefined1 in_stack_fffffffffffffa97;
  key_equal *in_stack_fffffffffffffa98;
  undefined6 in_stack_fffffffffffffaa0;
  undefined1 in_stack_fffffffffffffaa6;
  undefined1 in_stack_fffffffffffffaa7;
  char *in_stack_fffffffffffffaa8;
  int iVar9;
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffab0;
  Type in_stack_fffffffffffffabc;
  Type type;
  AssertHelper *in_stack_fffffffffffffac0;
  char *in_stack_fffffffffffffaf0;
  libc_allocator_with_realloc<std::pair<const_int,_int>_> *this_01;
  char *in_stack_fffffffffffffaf8;
  undefined7 in_stack_fffffffffffffb00;
  undefined1 in_stack_fffffffffffffb07;
  AssertionResult *in_stack_fffffffffffffb08;
  undefined6 in_stack_fffffffffffffb10;
  undefined1 in_stack_fffffffffffffb16;
  undefined1 in_stack_fffffffffffffb17;
  AssertionResult local_480;
  string local_470 [48];
  iterator local_440;
  undefined1 local_421;
  AssertionResult local_420;
  undefined4 local_40c;
  dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *local_408;
  pointer ppStack_400;
  pointer local_3f8;
  undefined4 local_3dc;
  AssertionResult local_3d8 [2];
  undefined4 local_3b4;
  AssertionResult local_3b0;
  string local_3a0 [48];
  iterator local_370;
  undefined1 local_351;
  AssertionResult local_350;
  undefined4 local_33c;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  local_338;
  undefined4 local_314;
  undefined4 local_310;
  libc_allocator_with_realloc<std::pair<const_int,_int>_> local_30b [103];
  undefined4 local_2a4;
  AssertionResult local_2a0;
  string local_290 [127];
  undefined1 local_211;
  AssertionResult local_210;
  undefined4 local_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined4 local_19c;
  AssertionResult local_198 [2];
  undefined4 local_174;
  AssertionResult local_170;
  string local_160 [127];
  undefined1 local_e1;
  AssertionResult local_e0;
  undefined4 local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined4 local_78;
  libc_allocator_with_realloc<std::pair<const_int,_int>_> local_63 [99];
  
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::libc_allocator_with_realloc
            (local_63);
  google::
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::sparse_hash_map(in_stack_fffffffffffffab0,(size_type)in_stack_fffffffffffffaa8,
                    (hasher *)
                    CONCAT17(in_stack_fffffffffffffaa7,
                             CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)),
                    in_stack_fffffffffffffa98,
                    (allocator_type *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90))
  ;
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::~libc_allocator_with_realloc
            (local_63);
  local_78 = 1;
  pdVar7 = google::
           sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           ::operator[]((sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                         *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
                        (key_type *)in_stack_fffffffffffffa88);
  *pdVar7 = 2;
  local_cc = 1;
  google::
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::find((sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
          *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
         (key_type *)in_stack_fffffffffffffa88);
  google::
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::end((sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
  local_e1 = google::
             sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
             ::operator!=((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                           *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
                          in_stack_fffffffffffffa88);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
             (bool *)in_stack_fffffffffffffa88,(type *)0x9de44c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffb08,
               (char *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
               in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffac0,in_stack_fffffffffffffabc,(char *)in_stack_fffffffffffffab0
               ,(int)((ulong)in_stack_fffffffffffffaa8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffaa7,
                                CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffffb17,
                        CONCAT16(in_stack_fffffffffffffb16,in_stack_fffffffffffffb10)),
               (Message *)in_stack_fffffffffffffb08);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    std::__cxx11::string::~string(local_160);
    testing::Message::~Message((Message *)0x9de577);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9de5f2);
  local_174 = 1;
  google::
  sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::operator->((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                *)0x9de60a);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffaa8,
             (char *)CONCAT17(in_stack_fffffffffffffaa7,
                              CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)),
             (int *)in_stack_fffffffffffffa98,
             (int *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_170);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffac0);
    testing::AssertionResult::failure_message((AssertionResult *)0x9de6b0);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffac0,in_stack_fffffffffffffabc,(char *)in_stack_fffffffffffffab0
               ,(int)((ulong)in_stack_fffffffffffffaa8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffaa7,
                                CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffffb17,
                        CONCAT16(in_stack_fffffffffffffb16,in_stack_fffffffffffffb10)),
               (Message *)in_stack_fffffffffffffb08);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    testing::Message::~Message((Message *)0x9de713);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9de76b);
  local_19c = 2;
  google::
  sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::operator->((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                *)0x9de783);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffaa8,
             (char *)CONCAT17(in_stack_fffffffffffffaa7,
                              CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)),
             (int *)in_stack_fffffffffffffa98,
             (int *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_198);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffac0);
    testing::AssertionResult::failure_message((AssertionResult *)0x9de82d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffac0,in_stack_fffffffffffffabc,(char *)in_stack_fffffffffffffab0
               ,(int)((ulong)in_stack_fffffffffffffaa8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffaa7,
                                CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffffb17,
                        CONCAT16(in_stack_fffffffffffffb16,in_stack_fffffffffffffb10)),
               (Message *)in_stack_fffffffffffffb08);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    testing::Message::~Message((Message *)0x9de890);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9de8e8);
  ppVar8 = google::
           sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           ::operator->((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                         *)0x9de8f5);
  ppVar8->second = 5;
  local_1fc = 1;
  google::
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::find((sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
          *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
         (key_type *)in_stack_fffffffffffffa88);
  local_88 = local_1b8;
  local_98 = local_1c8;
  uStack_90 = uStack_1c0;
  local_a8 = local_1d8;
  uStack_a0 = uStack_1d0;
  local_b8 = local_1e8;
  uStack_b0 = uStack_1e0;
  local_c8 = local_1f8;
  uStack_c0 = uStack_1f0;
  google::
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::end((sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
  uVar2 = google::
          sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
          ::operator!=((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                        *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
                       in_stack_fffffffffffffa88);
  local_211 = uVar2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
             (bool *)in_stack_fffffffffffffa88,(type *)0x9de9e6);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(&local_210);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)in_stack_fffffffffffffac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffb08,
               (char *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
               in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffac0,in_stack_fffffffffffffabc,(char *)in_stack_fffffffffffffab0
               ,(int)((ulong)in_stack_fffffffffffffaa8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffaa7,
                                CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffb10)),
               (Message *)in_stack_fffffffffffffb08);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    std::__cxx11::string::~string(local_290);
    testing::Message::~Message((Message *)0x9deae4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9deb5f);
  local_2a4 = 5;
  assertion_result =
       (AssertionResult *)
       google::
       sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
       ::operator->((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                     *)0x9deb77);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffaa8,
             (char *)CONCAT17(in_stack_fffffffffffffaa7,
                              CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)),
             (int *)in_stack_fffffffffffffa98,
             (int *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
  uVar4 = testing::AssertionResult::operator_cast_to_bool(&local_2a0);
  if (!(bool)uVar4) {
    testing::Message::Message((Message *)in_stack_fffffffffffffac0);
    in_stack_fffffffffffffaf8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x9dec1b);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffac0,in_stack_fffffffffffffabc,(char *)in_stack_fffffffffffffab0
               ,(int)((ulong)in_stack_fffffffffffffaa8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffaa7,
                                CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffb10)),
               (Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    testing::Message::~Message((Message *)0x9dec78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9decd0);
  google::
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::~sparse_hash_map((sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                      *)0x9decdd);
  this_01 = local_30b;
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::libc_allocator_with_realloc
            (this_01);
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::dense_hash_map((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                    *)in_stack_fffffffffffffab0,(size_type)in_stack_fffffffffffffaa8,
                   (hasher *)
                   CONCAT17(in_stack_fffffffffffffaa7,
                            CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)),
                   in_stack_fffffffffffffa98,
                   (allocator_type *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::~libc_allocator_with_realloc
            (local_30b);
  local_310 = 0;
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::set_empty_key((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                   *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
                  (key_type *)in_stack_fffffffffffffa88);
  local_314 = 1;
  pdVar7 = google::
           dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           ::operator[]((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                         *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
                        (key_type *)in_stack_fffffffffffffa88);
  *pdVar7 = 2;
  local_33c = 1;
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::find((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
          *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
         (key_type *)in_stack_fffffffffffffa88);
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::end((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
  local_351 = google::
              dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
              ::operator!=(&local_338,&local_370);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
             (bool *)in_stack_fffffffffffffa88,(type *)0x9dedfa);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_350);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,(char *)CONCAT17(uVar4,in_stack_fffffffffffffb00),
               in_stack_fffffffffffffaf8,(char *)this_01);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffac0,in_stack_fffffffffffffabc,(char *)in_stack_fffffffffffffab0
               ,(int)((ulong)in_stack_fffffffffffffaa8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffaa7,
                                CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffb10)),
               (Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    std::__cxx11::string::~string(local_3a0);
    testing::Message::~Message((Message *)0x9def3e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9defb6);
  local_3b4 = 1;
  google::
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::operator->((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                *)0x9defce);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffaa8,
             (char *)CONCAT17(in_stack_fffffffffffffaa7,
                              CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)),
             (int *)in_stack_fffffffffffffa98,
             (int *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffac0);
    testing::AssertionResult::failure_message((AssertionResult *)0x9df068);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffac0,in_stack_fffffffffffffabc,(char *)in_stack_fffffffffffffab0
               ,(int)((ulong)in_stack_fffffffffffffaa8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffaa7,
                                CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffb10)),
               (Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    testing::Message::~Message((Message *)0x9df0c5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9df11a);
  local_3dc = 2;
  this_00 = google::
            dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
            ::operator->((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                          *)0x9df132);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffaa8,
             (char *)CONCAT17(in_stack_fffffffffffffaa7,
                              CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)),
             (int *)in_stack_fffffffffffffa98,
             (int *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
  iVar9 = (int)((ulong)in_stack_fffffffffffffaa8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3d8);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffabc);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffab0 =
         (sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0x9df1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,(char *)in_stack_fffffffffffffab0,iVar9,
               (char *)CONCAT17(in_stack_fffffffffffffaa7,
                                CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffb10)),
               (Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    testing::Message::~Message((Message *)0x9df22d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9df285);
  lhs_expression =
       google::
       dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
       ::operator->((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                     *)0x9df292);
  lhs_expression->second = 5;
  local_40c = 1;
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::find((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
          *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
         (key_type *)in_stack_fffffffffffffa88);
  local_338.end = local_3f8;
  local_338.ht = local_408;
  local_338.pos = ppStack_400;
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::end((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
  uVar5 = google::
          dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
          ::operator!=(&local_338,&local_440);
  local_421 = uVar5;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
             (bool *)in_stack_fffffffffffffa88,(type *)0x9df347);
  uVar6 = testing::AssertionResult::operator_cast_to_bool(&local_420);
  if (!(bool)uVar6) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,(char *)CONCAT17(uVar4,in_stack_fffffffffffffb00),
               in_stack_fffffffffffffaf8,(char *)this_01);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,(char *)in_stack_fffffffffffffab0,
               (int)((ulong)lhs_expression >> 0x20),
               (char *)CONCAT17(uVar5,CONCAT16(uVar6,in_stack_fffffffffffffaa0)));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffb10)),
               (Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
    std::__cxx11::string::~string(local_470);
    testing::Message::~Message((Message *)0x9df43f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9df4b7);
  lhs = google::
        dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
        ::operator->((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                      *)0x9df4cf);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)lhs_expression,
             (char *)CONCAT17(uVar5,CONCAT16(uVar6,in_stack_fffffffffffffaa0)),&lhs->first,
             (int *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
  iVar9 = (int)((ulong)lhs_expression >> 0x20);
  uVar4 = testing::AssertionResult::operator_cast_to_bool(&local_480);
  if (!(bool)uVar4) {
    testing::Message::Message((Message *)this_00);
    testing::AssertionResult::failure_message((AssertionResult *)0x9df56d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,(char *)in_stack_fffffffffffffab0,iVar9,
               (char *)CONCAT17(uVar5,CONCAT16(uVar6,in_stack_fffffffffffffaa0)));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffb10)),
               (Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffffa90));
    testing::Message::~Message((Message *)0x9df5c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9df61d);
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::~dense_hash_map((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                     *)0x9df62a);
  return;
}

Assistant:

TEST(HashtableTest, ModifyViaIterator) {
  // This only works for hash-maps, since only they have non-const values.
  {
    sparse_hash_map<int, int> ht;
    ht[1] = 2;
    sparse_hash_map<int, int>::iterator it = ht.find(1);
    EXPECT_TRUE(it != ht.end());
    EXPECT_EQ(1, it->first);
    EXPECT_EQ(2, it->second);
    it->second = 5;
    it = ht.find(1);
    EXPECT_TRUE(it != ht.end());
    EXPECT_EQ(5, it->second);
  }
  {
    dense_hash_map<int, int> ht;
    ht.set_empty_key(0);
    ht[1] = 2;
    dense_hash_map<int, int>::iterator it = ht.find(1);
    EXPECT_TRUE(it != ht.end());
    EXPECT_EQ(1, it->first);
    EXPECT_EQ(2, it->second);
    it->second = 5;
    it = ht.find(1);
    EXPECT_TRUE(it != ht.end());
    EXPECT_EQ(5, it->second);
  }
}